

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency_transform.cc
# Opt level: O3

void __thiscall
sptk::FrequencyTransform::FrequencyTransform
          (FrequencyTransform *this,int num_input_order,int num_output_order,double alpha)

{
  bool bVar1;
  
  this->_vptr_FrequencyTransform = (_func_int **)&PTR__FrequencyTransform_00112c68;
  this->num_input_order_ = num_input_order;
  this->num_output_order_ = num_output_order;
  this->alpha_ = alpha;
  this->is_valid_ = true;
  if ((-1 < (num_output_order | num_input_order)) && (bVar1 = IsValidAlpha(alpha), bVar1)) {
    return;
  }
  this->is_valid_ = false;
  return;
}

Assistant:

FrequencyTransform::FrequencyTransform(int num_input_order,
                                       int num_output_order, double alpha)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      alpha_(alpha),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      !sptk::IsValidAlpha(alpha_)) {
    is_valid_ = false;
    return;
  }
}